

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

void get_default_volpan(DUMB_IT_SIGDATA *sigdata,IT_CHANNEL *channel)

{
  byte bVar1;
  IT_INSTRUMENT *pIVar2;
  int iVar3;
  IT_INSTRUMENT *instrument;
  int pan;
  IT_CHANNEL *channel_local;
  DUMB_IT_SIGDATA *sigdata_local;
  
  if (channel->sample != 0) {
    channel->volume = sigdata->sample[(int)(channel->sample - 1)].default_volume;
    if ((sigdata->flags & 0x40U) == 0) {
      bVar1 = sigdata->sample[(int)(channel->sample - 1)].default_pan;
      if ((bVar1 < 0x80) || (0xc0 < bVar1)) {
        if ((sigdata->flags & 4U) != 0) {
          pIVar2 = sigdata->instrument;
          iVar3 = channel->instrument - 1;
          if (pIVar2[iVar3].default_pan < 0x41) {
            channel->pan = pIVar2[iVar3].default_pan;
          }
          if (0x7f < pIVar2[iVar3].filter_cutoff) {
            channel->filter_cutoff = pIVar2[iVar3].filter_cutoff + 0x80;
          }
          if (0x7f < pIVar2[iVar3].filter_resonance) {
            channel->filter_resonance = pIVar2[iVar3].filter_resonance + 0x80;
          }
        }
      }
      else {
        channel->pan = bVar1 + 0x80;
      }
    }
    else if ((sigdata->flags & 0x80U) == 0) {
      channel->truepan =
           (ushort)sigdata->sample[(int)(channel->sample - 1)].default_pan * 0x40 + 0x20;
    }
  }
  return;
}

Assistant:

static void get_default_volpan(DUMB_IT_SIGDATA *sigdata, IT_CHANNEL *channel)
{
	if (channel->sample == 0)
		return;

	channel->volume = sigdata->sample[channel->sample-1].default_volume;

	if (sigdata->flags & IT_WAS_AN_XM) {
		if (!(sigdata->flags & IT_WAS_A_MOD))
			channel->truepan = 32 + sigdata->sample[channel->sample-1].default_pan*64;
		return;
	}

	{
		int pan = sigdata->sample[channel->sample-1].default_pan;
		if (pan >= 128 && pan <= 192) {
			channel->pan = pan - 128;
			return;
		}
	}

	if (sigdata->flags & IT_USE_INSTRUMENTS) {
		IT_INSTRUMENT *instrument = &sigdata->instrument[channel->instrument-1];
		if (instrument->default_pan <= 64)
			channel->pan = instrument->default_pan;
		if (instrument->filter_cutoff >= 128)
			channel->filter_cutoff = instrument->filter_cutoff - 128;
		if (instrument->filter_resonance >= 128)
			channel->filter_resonance = instrument->filter_resonance - 128;
	}
}